

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O0

void CmdPrintTable(st__table *tTable,int fAliases)

{
  int iVar1;
  Abc_Frame_t *pAbc;
  int local_40;
  int local_3c;
  int i;
  int nNames;
  char *value;
  char *key;
  char **ppNames;
  st__generator *gen;
  st__table *psStack_10;
  int fAliases_local;
  st__table *tTable_local;
  
  gen._4_4_ = fAliases;
  psStack_10 = tTable;
  key = (char *)malloc((long)tTable->num_entries << 3);
  local_3c = 0;
  ppNames = (char **)st__init_gen(psStack_10);
  while (iVar1 = st__gen((st__generator *)ppNames,&value,(char **)&i), iVar1 != 0) {
    *(char **)(key + (long)local_3c * 8) = value;
    local_3c = local_3c + 1;
  }
  st__free_gen((st__generator *)ppNames);
  qsort(key,(long)local_3c,8,CmdNamePrintCompare);
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    st__lookup(psStack_10,*(char **)(key + (long)local_40 * 8),(char **)&i);
    if (gen._4_4_ == 0) {
      fprintf(_stdout,"%-15s %-15s\n",*(undefined8 *)(key + (long)local_40 * 8),_i);
    }
    else {
      pAbc = Abc_FrameGetGlobalFrame();
      CmdCommandAliasPrint(pAbc,_i);
    }
  }
  if (key != (char *)0x0) {
    free(key);
  }
  return;
}

Assistant:

void CmdPrintTable( st__table * tTable, int fAliases )
{
    st__generator * gen;
    const char ** ppNames;
    const char * key;
    char* value;
    int nNames, i;

    // collect keys in the array
    ppNames = ABC_ALLOC( const char *, st__count(tTable) );
    nNames = 0;
    st__foreach_item( tTable, gen, &key, &value )
        ppNames[nNames++] = key;

    // sort array by name
    qsort( (void *)ppNames, nNames, sizeof(char *), 
        (int (*)(const void *, const void *))CmdNamePrintCompare );

    // print in this order
    for ( i = 0; i < nNames; i++ )
    {
        st__lookup( tTable, ppNames[i], &value );
        if ( fAliases )
            CmdCommandAliasPrint( Abc_FrameGetGlobalFrame(), (Abc_Alias *)value );
        else
            fprintf( stdout, "%-15s %-15s\n", ppNames[i], value );
    }
    ABC_FREE( ppNames );
}